

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  byte *pbVar16;
  byte bVar17;
  int iVar18;
  undefined4 in_register_0000000c;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint n;
  uint uVar22;
  stbi__context *unaff_R13;
  size_t __size;
  bool bVar23;
  uint local_94;
  uint local_84;
  stbi__context *local_80;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar7 = stbi__gif_header(s,g,comp,0);
    if (iVar7 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar7 = g->h * g->w;
    __size = (size_t)(iVar7 * 4);
    unaff_R13 = (stbi__context *)malloc(__size);
    g->out = (stbi_uc *)unaff_R13;
    psVar13 = (stbi_uc *)malloc(__size);
    g->background = psVar13;
    psVar14 = (stbi_uc *)malloc((long)iVar7);
    g->history = psVar14;
    if (unaff_R13 == (stbi__context *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (stbi_uc *)0x0;
    }
    memset(unaff_R13,0,__size);
    memset(psVar13,0,__size);
    memset(psVar14,0,(long)iVar7);
  }
  else {
    uVar21 = (uint)g->eflags >> 2 & 7;
    uVar6 = g->h * g->w;
    uVar12 = 2;
    if (uVar21 != 3) {
      uVar12 = uVar21;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar12 = uVar21;
    }
    if (uVar12 == 3) {
      if (0 < (int)uVar6) {
        uVar19 = 0;
        do {
          if (g->history[uVar19] != '\0') {
            *(undefined4 *)(g->out + uVar19 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar19 * 4);
          }
          uVar19 = uVar19 + 1;
        } while (uVar6 != uVar19);
      }
    }
    else if ((uVar12 == 2) && (0 < (int)uVar6)) {
      uVar19 = 0;
      do {
        if (g->history[uVar19] != '\0') {
          *(undefined4 *)(g->out + uVar19 * 4) = *(undefined4 *)(g->background + uVar19 * 4);
        }
        uVar19 = uVar19 + 1;
      } while (uVar6 != uVar19);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
  }
  memset(g->history,0,(long)g->h * (long)g->w);
  psVar13 = s->buffer_start;
  psVar14 = s->buffer_start + 1;
  do {
    psVar15 = s->img_buffer;
    if (psVar15 < s->img_buffer_end) {
LAB_0014427d:
      s->img_buffer = psVar15 + 1;
      sVar3 = *psVar15;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar13;
          s->img_buffer_end = psVar14;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar13;
          s->img_buffer_end = psVar13 + iVar7;
        }
        psVar15 = s->img_buffer;
        goto LAB_0014427d;
      }
      sVar3 = '\0';
    }
    if (sVar3 == '!') {
      psVar15 = s->img_buffer;
      if (s->img_buffer_end <= psVar15) {
        if (s->read_from_callbacks == 0) goto LAB_00144c11;
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar13;
          s->img_buffer_end = psVar14;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar13;
          s->img_buffer_end = psVar13 + iVar7;
        }
        psVar15 = s->img_buffer;
      }
      s->img_buffer = psVar15 + 1;
      if (*psVar15 != 0xf9) goto LAB_00144c11;
      pbVar16 = s->img_buffer;
      if (pbVar16 < s->img_buffer_end) {
LAB_00144496:
        s->img_buffer = pbVar16 + 1;
        bVar4 = *pbVar16;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar13;
            s->img_buffer_end = psVar14;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar13;
            s->img_buffer_end = psVar13 + iVar7;
          }
          pbVar16 = s->img_buffer;
          goto LAB_00144496;
        }
        bVar4 = 0;
      }
      if (bVar4 == 4) {
        pbVar16 = s->img_buffer;
        if (pbVar16 < s->img_buffer_end) {
LAB_0014463a:
          s->img_buffer = pbVar16 + 1;
          uVar12 = (uint)*pbVar16;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar14;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar13 + iVar7;
            }
            pbVar16 = s->img_buffer;
            goto LAB_0014463a;
          }
          uVar12 = 0;
        }
        g->eflags = uVar12;
        iVar7 = stbi__get16le(s);
        g->delay = iVar7 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          pbVar16 = s->img_buffer;
          if (pbVar16 < s->img_buffer_end) {
LAB_00144bec:
            s->img_buffer = pbVar16 + 1;
            bVar4 = *pbVar16;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar14;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar13 + iVar7;
              }
              pbVar16 = s->img_buffer;
              goto LAB_00144bec;
            }
            bVar4 = 0;
          }
          g->transparent = (uint)bVar4;
          g->pal[bVar4][3] = '\0';
          goto LAB_00144c11;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0014468f:
          s->img_buffer = s->img_buffer + 1;
        }
        else {
          iVar7 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
          if (0 < iVar7) goto LAB_0014468f;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar7);
        }
        g->transparent = -1;
LAB_00144c11:
        do {
          pbVar16 = s->img_buffer;
          if (pbVar16 < s->img_buffer_end) {
LAB_00144c76:
            s->img_buffer = pbVar16 + 1;
            bVar4 = *pbVar16;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar14;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar13;
                s->img_buffer_end = psVar13 + iVar7;
              }
              pbVar16 = s->img_buffer;
              goto LAB_00144c76;
            }
            bVar4 = 0;
          }
          if (bVar4 == 0) goto LAB_00144c8b;
          stbi__skip(s,(uint)bVar4);
        } while( true );
      }
      stbi__skip(s,(uint)bVar4);
LAB_00144c8b:
      bVar23 = true;
    }
    else if (sVar3 == ';') {
      bVar23 = false;
      unaff_R13 = s;
    }
    else if (sVar3 == ',') {
      iVar7 = stbi__get16le(s);
      iVar8 = stbi__get16le(s);
      iVar9 = stbi__get16le(s);
      iVar10 = stbi__get16le(s);
      if ((g->w < iVar9 + iVar7) || (g->h < iVar10 + iVar8)) {
        stbi__g_failure_reason = "bad Image Descriptor";
      }
      else {
        iVar18 = g->w * 4;
        g->line_size = iVar18;
        g->start_x = iVar7 << 2;
        g->start_y = iVar8 * iVar18;
        g->max_x = (iVar9 + iVar7) * 4;
        g->max_y = iVar18 * (iVar10 + iVar8);
        g->cur_x = iVar7 << 2;
        g->cur_y = iVar8 * iVar18;
        pbVar16 = s->img_buffer;
        if (pbVar16 < s->img_buffer_end) {
LAB_0014452e:
          s->img_buffer = pbVar16 + 1;
          uVar12 = (uint)*pbVar16;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar14;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar13 + iVar7;
            }
            pbVar16 = s->img_buffer;
            goto LAB_0014452e;
          }
          uVar12 = 0;
        }
        g->lflags = uVar12;
        if ((uVar12 & 0x40) == 0) {
          g->step = g->line_size;
          g->parse = 0;
        }
        else {
          g->step = g->line_size << 3;
          g->parse = 3;
        }
        if ((char)(byte)uVar12 < '\0') {
          iVar7 = -1;
          if ((g->eflags & 1) != 0) {
            iVar7 = g->transparent;
          }
          stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)uVar12 & 7),iVar7);
          g->color_table = g->lpal[0];
        }
        else {
          if ((g->flags & 0x80) == 0) {
            stbi__g_failure_reason = "missing color table";
            goto LAB_00144359;
          }
          g->color_table = g->pal[0];
        }
        pbVar16 = s->img_buffer;
        if (pbVar16 < s->img_buffer_end) {
LAB_0014472a:
          s->img_buffer = pbVar16 + 1;
          bVar4 = *pbVar16;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar14;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar13;
              s->img_buffer_end = psVar13 + iVar7;
            }
            pbVar16 = s->img_buffer;
            goto LAB_0014472a;
          }
          bVar4 = 0;
        }
        if (bVar4 < 0xd) {
          uVar12 = 1 << (bVar4 & 0x1f);
          uVar19 = 0;
          do {
            g->codes[uVar19].prefix = -1;
            g->codes[uVar19].first = (stbi_uc)uVar19;
            g->codes[uVar19].suffix = (stbi_uc)uVar19;
            uVar19 = uVar19 + 1;
          } while (uVar12 != uVar19);
          uVar11 = (2 << (bVar4 & 0x1f)) - 1;
          local_94 = 0xffffffff;
          bVar23 = true;
          n = 0;
          iVar8 = 0;
          uVar21 = 0;
          uVar6 = uVar12 + 2;
          iVar7 = bVar4 + 1;
          local_84 = uVar11;
LAB_001447c5:
          do {
            iVar9 = iVar8 - iVar7;
            if (iVar7 <= iVar8) {
              bVar17 = (byte)iVar7;
              uVar22 = uVar21 & local_84;
              bVar2 = true;
              if (uVar22 == uVar12) {
                uVar22 = 0xffffffff;
                local_84 = uVar11;
                iVar7 = bVar4 + 1;
                local_94 = uVar12 + 2;
                bVar23 = false;
              }
              else {
                if (uVar22 == uVar12 + 1) {
                  do {
                    stbi__skip(s,n);
                    pbVar16 = s->img_buffer;
                    if (pbVar16 < s->img_buffer_end) {
LAB_001449a8:
                      s->img_buffer = pbVar16 + 1;
                      bVar5 = *pbVar16;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                        if (iVar8 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar13;
                          s->img_buffer_end = psVar14;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar13;
                          s->img_buffer_end = psVar13 + iVar8;
                        }
                        pbVar16 = s->img_buffer;
                        goto LAB_001449a8;
                      }
                      bVar5 = 0;
                    }
                    if (bVar5 == 0) goto LAB_001449e4;
                    n = (uint)bVar5;
                  } while( true );
                }
                if ((int)uVar6 < (int)uVar22) {
                  stbi__g_failure_reason = "illegal code in raster";
                }
                else if (bVar23) {
                  stbi__g_failure_reason = "no clear code";
                  bVar23 = true;
                }
                else {
                  if ((int)local_94 < 0) {
                    if (uVar22 != uVar6) goto LAB_00144ad4;
                    stbi__g_failure_reason = "illegal code in raster";
                  }
                  else {
                    uVar20 = uVar6 + 1;
                    if ((int)uVar6 < 0x2000) {
                      g->codes[(int)uVar6].prefix = (stbi__int16)local_94;
                      sVar3 = g->codes[local_94].first;
                      g->codes[(int)uVar6].first = sVar3;
                      if (uVar22 != uVar20) {
                        sVar3 = g->codes[(int)uVar22].first;
                      }
                      g->codes[(int)uVar6].suffix = sVar3;
                      uVar6 = uVar20;
LAB_00144ad4:
                      local_94 = uVar6;
                      stbi__out_gif_code(g,(stbi__uint16)uVar22);
                      bVar23 = (local_94 & local_84) == 0;
                      iVar8 = iVar7 + 1;
                      if ((int)local_94 < 0x1000 && bVar23) {
                        iVar7 = iVar8;
                      }
                      if ((int)local_94 < 0x1000 && bVar23) {
                        local_84 = ~(-1 << ((byte)iVar8 & 0x1f));
                      }
                      bVar23 = false;
                      bVar2 = true;
                      goto LAB_00144a2e;
                    }
                    stbi__g_failure_reason = "too many codes";
                    uVar6 = uVar20;
                  }
                  bVar23 = false;
                }
                bVar2 = false;
                local_80 = (stbi__context *)0x0;
                uVar22 = local_94;
                local_94 = uVar6;
              }
              goto LAB_00144a2e;
            }
            if (n == 0) {
              pbVar16 = s->img_buffer;
              if (pbVar16 < s->img_buffer_end) {
LAB_00144842:
                s->img_buffer = pbVar16 + 1;
                bVar17 = *pbVar16;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                  if (iVar9 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar13;
                    s->img_buffer_end = psVar14;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar13;
                    s->img_buffer_end = psVar13 + iVar9;
                  }
                  pbVar16 = s->img_buffer;
                  goto LAB_00144842;
                }
                bVar17 = 0;
              }
              if (bVar17 == 0) {
                local_80 = (stbi__context *)g->out;
                goto LAB_00144b3a;
              }
              n = (uint)bVar17;
            }
            pbVar16 = s->img_buffer;
            if (pbVar16 < s->img_buffer_end) {
LAB_001448c5:
              s->img_buffer = pbVar16 + 1;
              uVar22 = (uint)*pbVar16;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar9 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
                if (iVar9 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar13;
                  s->img_buffer_end = psVar14;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar13;
                  s->img_buffer_end = psVar13 + iVar9;
                }
                pbVar16 = s->img_buffer;
                goto LAB_001448c5;
              }
              uVar22 = 0;
            }
            bVar17 = (byte)iVar8;
            n = n - 1;
            iVar8 = iVar8 + 8;
            uVar21 = uVar21 | uVar22 << (bVar17 & 0x1f);
          } while( true );
        }
        local_80 = (stbi__context *)0x0;
LAB_00144b3a:
        if (local_80 != (stbi__context *)0x0) {
          unaff_R13 = local_80;
          if (psVar1 == (stbi_uc *)0x0) {
            uVar12 = g->h * g->w;
            if ((int)uVar12 < 1 || g->bgindex < 1) {
              bVar23 = false;
            }
            else {
              uVar19 = 0;
              do {
                if (g->history[uVar19] == '\0') {
                  g->pal[g->bgindex][3] = 0xff;
                  *(stbi_uc (*) [4])(g->out + uVar19 * 4) = g->pal[g->bgindex];
                }
                uVar19 = uVar19 + 1;
                bVar23 = false;
              } while (uVar12 != uVar19);
            }
          }
          else {
            bVar23 = false;
          }
          goto LAB_00144c8d;
        }
      }
      bVar23 = false;
      unaff_R13 = (stbi__context *)0x0;
    }
    else {
      stbi__g_failure_reason = "unknown code";
LAB_00144359:
      bVar23 = false;
      unaff_R13 = (stbi__context *)0x0;
    }
LAB_00144c8d:
    if (!bVar23) {
      return (stbi_uc *)unaff_R13;
    }
  } while( true );
LAB_001449e4:
  local_80 = (stbi__context *)g->out;
  n = 0;
  bVar2 = false;
  uVar22 = local_94;
  local_94 = uVar6;
LAB_00144a2e:
  iVar8 = iVar9;
  uVar21 = (int)uVar21 >> (bVar17 & 0x1f);
  uVar6 = local_94;
  local_94 = uVar22;
  if (!bVar2) goto LAB_00144b3a;
  goto LAB_001447c5;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0))     return 0; // stbi__g_failure_reason set by stbi__gif_header
      g->out = (stbi_uc *) stbi__malloc(4 * g->w * g->h);
      g->background = (stbi_uc *) stbi__malloc(4 * g->w * g->h); 
      g->history = (stbi_uc *) stbi__malloc(g->w * g->h); 
      if (g->out == 0)                      return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "tranparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to teh color that was there the previous frame. 
      memset( g->out, 0x00, 4 * g->w * g->h ); 
      memset( g->background, 0x00, 4 * g->w * g->h ); // state of the background (starts transparent)
      memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (o == NULL) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}